

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O0

void __thiscall
vkt::BindingModel::anon_unknown_1::BufferRenderInstance::logTestPlan(BufferRenderInstance *this)

{
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *this_02;
  char *local_368;
  char *local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  MessageBuilder local_318;
  ostringstream local_188 [8];
  ostringstream msg;
  BufferRenderInstance *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_188);
  poVar2 = std::operator<<((ostream *)local_188,"Rendering 2x2 yellow-green grid.\n");
  poVar2 = std::operator<<(poVar2,"Single descriptor set. Descriptor set contains ");
  if (this->m_shaderInterface == SHADER_INPUT_SINGLE_DESCRIPTOR) {
    local_360 = "single";
  }
  else {
    if (this->m_shaderInterface == SHADER_INPUT_MULTIPLE_CONTIGUOUS_DESCRIPTORS) {
      local_368 = "two";
    }
    else {
      local_368 = (char *)0x0;
      if (this->m_shaderInterface == SHADER_INPUT_DESCRIPTOR_ARRAY) {
        local_368 = "an array (size 2) of";
      }
    }
    local_360 = local_368;
  }
  poVar2 = std::operator<<(poVar2,local_360);
  poVar2 = std::operator<<(poVar2," descriptor(s) of type ");
  pcVar3 = ::vk::getDescriptorTypeName(this->m_descriptorType);
  poVar2 = std::operator<<(poVar2,pcVar3);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"Buffer view(s) have ");
  pcVar3 = "";
  if ((this->m_setViewOffset & 1U) != 0) {
    pcVar3 = "non-";
  }
  poVar2 = std::operator<<(poVar2,pcVar3);
  std::operator<<(poVar2,"zero offset.\n");
  bVar1 = isDynamicDescriptorType(this->m_descriptorType);
  if (bVar1) {
    if ((this->m_setDynamicOffset & 1U) == 0) {
      std::operator<<((ostream *)local_188,
                      "Dynamic offset is not supplied at bind time. Expecting bind to offset 0.\n");
    }
    else {
      poVar2 = std::operator<<((ostream *)local_188,
                               "Source buffer(s) are given a dynamic offset at bind time.\n");
      poVar2 = std::operator<<(poVar2,"The supplied dynamic offset is ");
      pcVar3 = "";
      if ((this->m_dynamicOffsetNonZero & 1U) != 0) {
        pcVar3 = "non-";
      }
      poVar2 = std::operator<<(poVar2,pcVar3);
      std::operator<<(poVar2,"zero.\n");
    }
  }
  if (this->m_stageFlags == 0) {
    std::operator<<((ostream *)local_188,"Descriptors are not accessed in any shader stage.\n");
  }
  else {
    poVar2 = std::operator<<((ostream *)local_188,"Descriptors are accessed in {");
    pcVar3 = "";
    if ((this->m_stageFlags & 1) != 0) {
      pcVar3 = " vertex";
    }
    poVar2 = std::operator<<(poVar2,pcVar3);
    pcVar3 = "";
    if ((this->m_stageFlags & 2) != 0) {
      pcVar3 = " tess_control";
    }
    poVar2 = std::operator<<(poVar2,pcVar3);
    pcVar3 = "";
    if ((this->m_stageFlags & 4) != 0) {
      pcVar3 = " tess_evaluation";
    }
    poVar2 = std::operator<<(poVar2,pcVar3);
    pcVar3 = "";
    if ((this->m_stageFlags & 8) != 0) {
      pcVar3 = " geometry";
    }
    poVar2 = std::operator<<(poVar2,pcVar3);
    pcVar3 = "";
    if ((this->m_stageFlags & 0x10) != 0) {
      pcVar3 = " fragment";
    }
    poVar2 = std::operator<<(poVar2,pcVar3);
    std::operator<<(poVar2," } stages.\n");
  }
  this_00 = Context::getTestContext
                      ((this->super_SingleCmdRenderInstance).super_SingleTargetRenderInstance.
                       super_TestInstance.m_context);
  this_01 = tcu::TestContext::getLog(this_00);
  tcu::TestLog::operator<<(&local_318,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
  std::__cxx11::ostringstream::str();
  this_02 = tcu::MessageBuilder::operator<<(&local_318,&local_338);
  tcu::MessageBuilder::operator<<(this_02,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::string::~string((string *)&local_338);
  tcu::MessageBuilder::~MessageBuilder(&local_318);
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return;
}

Assistant:

void BufferRenderInstance::logTestPlan (void) const
{
	std::ostringstream msg;

	msg << "Rendering 2x2 yellow-green grid.\n"
		<< "Single descriptor set. Descriptor set contains "
			<< ((m_shaderInterface == SHADER_INPUT_SINGLE_DESCRIPTOR) ? "single" :
			    (m_shaderInterface == SHADER_INPUT_MULTIPLE_CONTIGUOUS_DESCRIPTORS) ? "two" :
			    (m_shaderInterface == SHADER_INPUT_DESCRIPTOR_ARRAY) ? "an array (size 2) of" :
			    (const char*)DE_NULL)
		<< " descriptor(s) of type " << vk::getDescriptorTypeName(m_descriptorType) << "\n"
		<< "Buffer view(s) have " << ((m_setViewOffset) ? ("non-") : ("")) << "zero offset.\n";

	if (isDynamicDescriptorType(m_descriptorType))
	{
		if (m_setDynamicOffset)
		{
			msg << "Source buffer(s) are given a dynamic offset at bind time.\n"
				<< "The supplied dynamic offset is " << ((m_dynamicOffsetNonZero) ? ("non-") : ("")) << "zero.\n";
		}
		else
		{
			msg << "Dynamic offset is not supplied at bind time. Expecting bind to offset 0.\n";
		}
	}

	if (m_stageFlags == 0u)
	{
		msg << "Descriptors are not accessed in any shader stage.\n";
	}
	else
	{
		msg << "Descriptors are accessed in {"
			<< (((m_stageFlags & vk::VK_SHADER_STAGE_VERTEX_BIT) != 0)					? (" vertex")			: (""))
			<< (((m_stageFlags & vk::VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT) != 0)	? (" tess_control")		: (""))
			<< (((m_stageFlags & vk::VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT) != 0)	? (" tess_evaluation")	: (""))
			<< (((m_stageFlags & vk::VK_SHADER_STAGE_GEOMETRY_BIT) != 0)				? (" geometry")			: (""))
			<< (((m_stageFlags & vk::VK_SHADER_STAGE_FRAGMENT_BIT) != 0)				? (" fragment")			: (""))
			<< " } stages.\n";
	}

	m_context.getTestContext().getLog()
		<< tcu::TestLog::Message
		<< msg.str()
		<< tcu::TestLog::EndMessage;
}